

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void nite::print(int n)

{
  int in_EDX;
  string local_30;
  int local_c;
  int n_local;
  
  local_c = n;
  toStr_abi_cxx11_(&local_30,(nite *)(ulong)(uint)n,in_EDX);
  print(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void nite::print(int n){
	nite::print(nite::toStr(n));
}